

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O1

void ncnn::original_pre_calc_for_bilinear_interpolate<float>
               (int height,int width,int pooled_height,int pooled_width,float roi_start_h,
               float roi_start_w,float bin_size_h,float bin_size_w,int sampling_ratio,
               vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *pre_calc)

{
  int iVar1;
  int iVar2;
  pointer pPVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (0 < pooled_height) {
    fVar14 = (float)height;
    fVar23 = (float)width;
    iVar8 = 0;
    iVar4 = 0;
    do {
      if (0 < pooled_width) {
        fVar18 = (float)iVar4 * bin_size_h + roi_start_h;
        if (fVar18 <= 0.0) {
          fVar18 = 0.0;
        }
        if (fVar14 <= fVar18) {
          fVar18 = fVar14;
        }
        fVar15 = (float)(iVar4 + 1) * bin_size_h + roi_start_h;
        if (fVar15 <= 0.0) {
          fVar15 = 0.0;
        }
        if (fVar14 <= fVar15) {
          fVar15 = fVar14;
        }
        fVar16 = ceilf(fVar15 - fVar18);
        fVar15 = (float)sampling_ratio;
        if (sampling_ratio < 1) {
          fVar15 = fVar16;
        }
        iVar5 = 0;
        do {
          fVar16 = (float)iVar5;
          iVar5 = iVar5 + 1;
          fVar16 = fVar16 * bin_size_w + roi_start_w;
          if (fVar16 <= 0.0) {
            fVar16 = 0.0;
          }
          if (fVar23 <= fVar16) {
            fVar16 = fVar23;
          }
          fVar17 = (float)sampling_ratio;
          if (sampling_ratio < 1) {
            fVar17 = (float)iVar5 * bin_size_w + roi_start_w;
            if (fVar17 <= 0.0) {
              fVar17 = 0.0;
            }
            if (fVar23 <= fVar17) {
              fVar17 = fVar23;
            }
            fVar17 = ceilf(fVar17 - fVar16);
          }
          if (0 < (int)fVar15) {
            iVar6 = (int)fVar17;
            pPVar3 = (pre_calc->
                     super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar7 = 0;
            do {
              if (0 < iVar6) {
                fVar21 = ((float)iVar7 + 0.5) * bin_size_h * (1.0 / (float)(int)fVar15) + fVar18;
                iVar1 = (int)fVar21 + 1;
                uVar19 = (int)((uint)(iVar1 < height) << 0x1f) >> 0x1f;
                fVar20 = (float)((uint)(fVar21 - (float)(int)fVar21) &
                                (int)((uint)(iVar1 < height) << 0x1f) >> 0x1f);
                fVar17 = (float)(~uVar19 & 0x3f800000 | (uint)((float)iVar1 - fVar21) & uVar19);
                if (height <= iVar1) {
                  iVar1 = height + -1;
                }
                iVar9 = (int)fVar21 * width;
                pfVar10 = &pPVar3[iVar8].w1;
                iVar11 = 0;
                do {
                  fVar21 = ((float)iVar11 + 0.5) * bin_size_w * (1.0 / (float)iVar6) + fVar16;
                  iVar12 = (int)fVar21;
                  iVar2 = iVar12 + 1;
                  iVar13 = iVar2;
                  if (width <= iVar2) {
                    iVar13 = width + -1;
                  }
                  ((PreCalc<float> *)(pfVar10 + -4))->pos1 = iVar9 + iVar12;
                  pfVar10[-3] = (float)(iVar13 + iVar9);
                  pfVar10[-2] = (float)(iVar12 + iVar1 * width);
                  pfVar10[-1] = (float)(iVar13 + iVar1 * width);
                  uVar19 = (int)((uint)(iVar2 < width) << 0x1f) >> 0x1f;
                  fVar22 = (float)((uint)(fVar21 - (float)(int)fVar21) &
                                  (int)((uint)(iVar2 < width) << 0x1f) >> 0x1f);
                  fVar21 = (float)(~uVar19 & 0x3f800000 | (uint)((float)iVar2 - fVar21) & uVar19);
                  *pfVar10 = fVar21 * fVar17;
                  pfVar10[1] = fVar22 * fVar17;
                  pfVar10[2] = fVar21 * fVar20;
                  pfVar10[3] = fVar22 * fVar20;
                  iVar11 = iVar11 + 1;
                  pfVar10 = pfVar10 + 8;
                } while (iVar6 != iVar11);
                iVar8 = iVar8 + iVar11;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != (int)fVar15);
          }
        } while (iVar5 != pooled_width);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != pooled_height);
  }
  return;
}

Assistant:

void original_pre_calc_for_bilinear_interpolate(
    const int height,
    const int width,
    const int pooled_height,
    const int pooled_width,
    T roi_start_h,
    T roi_start_w,
    T bin_size_h,
    T bin_size_w,
    int sampling_ratio,
    std::vector<PreCalc<T> >& pre_calc)
{
    int pre_calc_index = 0;
    for (int ph = 0; ph < pooled_height; ph++)
    {
        for (int pw = 0; pw < pooled_width; pw++)
        {
            float hstart = roi_start_h + ph * bin_size_h;
            float wstart = roi_start_w + pw * bin_size_w;
            float hend = roi_start_h + (ph + 1) * bin_size_h;
            float wend = roi_start_w + (pw + 1) * bin_size_w;
            hstart = std::min(std::max(hstart, 0.f), (float)height);
            wstart = std::min(std::max(wstart, 0.f), (float)width);
            hend = std::min(std::max(hend, 0.f), (float)height);
            wend = std::min(std::max(wend, 0.f), (float)width);

            int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
            int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

            for (int by = 0; by < bin_grid_h; by++)
            {
                float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                for (int bx = 0; bx < bin_grid_w; bx++)
                {
                    float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;
                    int x0 = (int)x;
                    int x1 = x0 + 1;
                    int y0 = (int)y;
                    int y1 = y0 + 1;

                    float a0 = x1 - x;
                    float a1 = x - x0;
                    float b0 = y1 - y;
                    float b1 = y - y0;

                    if (x1 >= width)
                    {
                        x1 = width - 1;
                        a0 = 1.f;
                        a1 = 0.f;
                    }
                    if (y1 >= height)
                    {
                        y1 = height - 1;
                        b0 = 1.f;
                        b1 = 0.f;
                    }
                    // save weights and indices
                    PreCalc<T> pc;
                    pc.pos1 = y0 * width + x0;
                    pc.pos2 = y0 * width + x1;
                    pc.pos3 = y1 * width + x0;
                    pc.pos4 = y1 * width + x1;
                    pc.w1 = a0 * b0;
                    pc.w2 = a1 * b0;
                    pc.w3 = a0 * b1;
                    pc.w4 = a1 * b1;
                    pre_calc[pre_calc_index++] = pc;
                }
            }
        }
    }
}